

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O0

expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* tinyusdz::prim::PurposeEnumHandler
            (expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *tok)

{
  initializer_list<std::pair<tinyusdz::Purpose,_const_char_*>_> __l;
  pair<tinyusdz::Purpose,_const_char_*> pVar1;
  allocator local_b9;
  string local_b8;
  allocator<std::pair<tinyusdz::Purpose,_const_char_*>_> local_91;
  Purpose local_90 [4];
  pair<tinyusdz::Purpose,_const_char_*> local_80;
  Purpose local_70;
  char *local_68;
  Purpose local_60;
  char *local_58;
  Purpose local_50;
  char *local_48;
  iterator local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<std::pair<tinyusdz::Purpose,_const_char_*>,_std::allocator<std::pair<tinyusdz::Purpose,_const_char_*>_>_>
  enums;
  string *tok_local;
  
  local_90[3] = 0;
  enums.
  super__Vector_base<std::pair<tinyusdz::Purpose,_const_char_*>,_std::allocator<std::pair<tinyusdz::Purpose,_const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)tok;
  pVar1 = ::std::make_pair<tinyusdz::Purpose,char_const(&)[8]>(local_90 + 3,(char (*) [8])0x6462f9);
  local_80.second = pVar1.second;
  local_80.first = pVar1.first;
  local_90[2] = 2;
  pVar1 = ::std::make_pair<tinyusdz::Purpose,char_const(&)[6]>(local_90 + 2,(char (*) [6])"proxy");
  local_68 = pVar1.second;
  local_70 = pVar1.first;
  local_90[1] = 1;
  pVar1 = ::std::make_pair<tinyusdz::Purpose,char_const(&)[7]>(local_90 + 1,(char (*) [7])"render");
  local_58 = pVar1.second;
  local_60 = pVar1.first;
  local_90[0] = Guide;
  pVar1 = ::std::make_pair<tinyusdz::Purpose,char_const(&)[6]>(local_90,(char (*) [6])"guide");
  local_48 = pVar1.second;
  local_50 = pVar1.first;
  local_40 = &local_80;
  local_38 = 4;
  ::std::allocator<std::pair<tinyusdz::Purpose,_const_char_*>_>::allocator(&local_91);
  __l._M_len = local_38;
  __l._M_array = local_40;
  ::std::
  vector<std::pair<tinyusdz::Purpose,_const_char_*>,_std::allocator<std::pair<tinyusdz::Purpose,_const_char_*>_>_>
  ::vector((vector<std::pair<tinyusdz::Purpose,_const_char_*>,_std::allocator<std::pair<tinyusdz::Purpose,_const_char_*>_>_>
            *)local_30,__l,&local_91);
  ::std::allocator<std::pair<tinyusdz::Purpose,_const_char_*>_>::~allocator(&local_91);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_b8,"purpose",&local_b9);
  anon_unknown_0::EnumHandler<tinyusdz::Purpose>
            (__return_storage_ptr__,&local_b8,
             (string *)
             enums.
             super__Vector_base<std::pair<tinyusdz::Purpose,_const_char_*>,_std::allocator<std::pair<tinyusdz::Purpose,_const_char_*>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::pair<tinyusdz::Purpose,_const_char_*>,_std::allocator<std::pair<tinyusdz::Purpose,_const_char_*>_>_>
              *)local_30);
  ::std::__cxx11::string::~string((string *)&local_b8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  ::std::
  vector<std::pair<tinyusdz::Purpose,_const_char_*>,_std::allocator<std::pair<tinyusdz::Purpose,_const_char_*>_>_>
  ::~vector((vector<std::pair<tinyusdz::Purpose,_const_char_*>,_std::allocator<std::pair<tinyusdz::Purpose,_const_char_*>_>_>
             *)local_30);
  return __return_storage_ptr__;
}

Assistant:

static nonstd::expected<Purpose, std::string> PurposeEnumHandler(const std::string &tok) {
  using EnumTy = std::pair<Purpose, const char *>;
  const std::vector<EnumTy> enums = {
      std::make_pair(Purpose::Default, "default"),
      std::make_pair(Purpose::Proxy, "proxy"),
      std::make_pair(Purpose::Render, "render"),
      std::make_pair(Purpose::Guide, "guide"),
  };
  return EnumHandler<Purpose>("purpose", tok, enums);
}